

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

UConverter *
ucnv_createConverterFromPackage_63(char *packageName,char *converterName,UErrorCode *err)

{
  UBool UVar1;
  UConverterSharedData *mySharedConverterData_00;
  undefined1 local_140 [8];
  UConverterLoadArgs stackArgs;
  UConverterNamePieces stackPieces;
  UConverterSharedData *mySharedConverterData;
  UConverter *myUConverter;
  UErrorCode *err_local;
  char *converterName_local;
  char *packageName_local;
  
  memset(local_140,0,0x28);
  local_140._0_4_ = 0x28;
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    stackArgs.locale._0_1_ = 0;
    parseConverterOptions
              (converterName,(UConverterNamePieces *)&stackArgs.locale,
               (UConverterLoadArgs *)local_140,err);
    UVar1 = U_FAILURE(*err);
    if (UVar1 == '\0') {
      local_140._4_4_ = 1;
      stackArgs._8_8_ = packageName;
      mySharedConverterData_00 = createConverterFromFile((UConverterLoadArgs *)local_140,err);
      UVar1 = U_FAILURE(*err);
      if (UVar1 == '\0') {
        packageName_local =
             (char *)ucnv_createConverterFromSharedData_63
                               ((UConverter *)0x0,mySharedConverterData_00,
                                (UConverterLoadArgs *)local_140,err);
        UVar1 = U_FAILURE(*err);
        if (UVar1 != '\0') {
          ucnv_close_63((UConverter *)packageName_local);
          packageName_local = (char *)0x0;
        }
      }
      else {
        packageName_local = (char *)0x0;
      }
    }
    else {
      packageName_local = (char *)0x0;
    }
  }
  else {
    packageName_local = (char *)0x0;
  }
  return (UConverter *)packageName_local;
}

Assistant:

U_CFUNC UConverter*
ucnv_createConverterFromPackage(const char *packageName, const char *converterName, UErrorCode * err)
{
    UConverter *myUConverter;
    UConverterSharedData *mySharedConverterData;
    UConverterNamePieces stackPieces;
    UConverterLoadArgs stackArgs=UCNV_LOAD_ARGS_INITIALIZER;

    UTRACE_ENTRY_OC(UTRACE_UCNV_OPEN_PACKAGE);

    if(U_FAILURE(*err)) {
        UTRACE_EXIT_STATUS(*err);
        return NULL;
    }

    UTRACE_DATA2(UTRACE_OPEN_CLOSE, "open converter %s from package %s", converterName, packageName);

    /* first, get the options out of the converterName string */
    stackPieces.cnvName[0] = 0;
    stackPieces.locale[0] = 0;
    stackPieces.options = 0;
    parseConverterOptions(converterName, &stackPieces, &stackArgs, err);
    if (U_FAILURE(*err)) {
        /* Very bad name used. */
        UTRACE_EXIT_STATUS(*err);
        return NULL;
    }
    stackArgs.nestedLoads=1;
    stackArgs.pkg=packageName;

    /* open the data, unflatten the shared structure */
    mySharedConverterData = createConverterFromFile(&stackArgs, err);

    if (U_FAILURE(*err)) {
        UTRACE_EXIT_STATUS(*err);
        return NULL;
    }

    /* create the actual converter */
    myUConverter = ucnv_createConverterFromSharedData(NULL, mySharedConverterData, &stackArgs, err);

    if (U_FAILURE(*err)) {
        ucnv_close(myUConverter);
        UTRACE_EXIT_STATUS(*err);
        return NULL;
    }

    UTRACE_EXIT_PTR_STATUS(myUConverter, *err);
    return myUConverter;
}